

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcBinaryStream.h
# Opt level: O1

void __thiscall o3dgc::BinaryStream::WriteUInt32Bin(BinaryStream *this,unsigned_long value)

{
  uchar *value_00;
  undefined8 local_10;
  
  local_10 = value;
  if (this->m_endianness == O3DGC_BIG_ENDIAN) {
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&local_10 + 3));
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&local_10 + 2));
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&local_10 + 1));
    value_00 = (uchar *)&local_10;
  }
  else {
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)&local_10);
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&local_10 + 1));
    Vector<unsigned_char>::PushBack(&this->m_stream,(uchar *)((long)&local_10 + 2));
    value_00 = (uchar *)((long)&local_10 + 3);
  }
  Vector<unsigned_char>::PushBack(&this->m_stream,value_00);
  return;
}

Assistant:

void                    WriteUInt32Bin(unsigned long value) 
                                {
                                    unsigned char * ptr = (unsigned char *) (&value);
                                    if (m_endianness == O3DGC_BIG_ENDIAN)
                                    {
                                        m_stream.PushBack(ptr[3]);
                                        m_stream.PushBack(ptr[2]);
                                        m_stream.PushBack(ptr[1]);
                                        m_stream.PushBack(ptr[0]);
                                    }
                                    else
                                    {
                                        m_stream.PushBack(ptr[0]);
                                        m_stream.PushBack(ptr[1]);
                                        m_stream.PushBack(ptr[2]);
                                        m_stream.PushBack(ptr[3]);
                                    }
                                }